

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_declaration.h
# Opt level: O2

void __thiscall ncnn::Einsum_final::~Einsum_final(Einsum_final *this)

{
  Einsum::~Einsum((Einsum *)&this->field_0x8);
  operator_delete(this,0x110);
  return;
}

Assistant:

virtual int create_pipeline(const Option& opt) {
        { int ret = Einsum::create_pipeline(opt); if (ret) return ret; }
        return 0;
    }